

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

void __thiscall
GlobOpt::PreLowerCanonicalize(GlobOpt *this,Instr *instr,Value **pSrc1Val,Value **pSrc2Val)

{
  Opnd *opnd;
  Opnd *this_00;
  Opnd *this_01;
  Value *pVVar1;
  bool bVar2;
  Instr *instr_00;
  RegOpnd *pRVar3;
  uint uVar4;
  OpCode OVar5;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  opnd = instr->m_dst;
  this_00 = instr->m_src1;
  this_01 = instr->m_src2;
  bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
  if (!bVar2) {
    if (opnd == (Opnd *)0x0 || this_01 == (Opnd *)0x0) {
      return;
    }
    bVar2 = IR::Opnd::IsRegOpnd(this_01);
    if (!bVar2) {
      return;
    }
    if (((((this_01->field_0xb & 4) == 0) || ((this_00->field_0xb & 4) != 0)) ||
        (bVar2 = IR::Opnd::IsEqual(this_00,opnd), bVar2)) &&
       (bVar2 = IR::Opnd::IsEqual(this_01,opnd), !bVar2)) {
      return;
    }
    bVar2 = OpCodeAttr::OpndHasImplicitCall(instr->m_opcode);
    if (bVar2) {
      if (instr->m_kind == InstrKindBranch) {
        local_34 = (this_00->m_valueType).field_0;
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (!bVar2) {
          return;
        }
      }
      else {
        local_34 = (this_00->m_valueType).field_0;
        bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
        if (bVar2) goto LAB_004288b9;
      }
      local_32 = (this_01->m_valueType).field_0;
      bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
      if (!bVar2) {
        return;
      }
    }
  }
LAB_004288b9:
  OVar5 = instr->m_opcode;
  switch(OVar5) {
  case BrNotEq_A:
  case BrSrNotEq_A:
  case BrSrNotNeq_A:
  case BrEq_I4:
  case BrNeq_I4:
  case Add_I4:
  case Mul_I4:
  case And_I4:
  case Or_I4:
  case Xor_I4:
    break;
  case BrNotNeq_A:
    goto switchD_00428aad_caseD_3b;
  case BrNotGe_A:
    OVar5 = BrNotLe_A;
    break;
  case BrNotGt_A:
    OVar5 = BrNotLt_A;
    break;
  case BrNotLt_A:
    OVar5 = BrNotGt_A;
    break;
  case BrNotLe_A:
    OVar5 = BrNotGe_A;
    break;
  case BrNotAddr_A:
  case BrAddr_A:
  case BrOnException:
  case BrOnNoException:
  case DeadBrEqual:
  case DeadBrSrEqual:
  case DeadBrRelational:
  case DeadBrOnHasProperty:
  case DeletedNonHelperBranch:
  case BrTrue_I4:
  case BrFalse_I4:
  case BrUnGe_I4:
  case BrUnGt_I4:
  case BrUnLt_I4:
  case BrUnLe_I4:
  case Call:
  case AsmJsCallI:
  case AsmJsCallE:
  case CallINew:
  case CallINewTargetNew:
  case CallIExtendedNew:
  case CallIEval:
  case CallIExtendedNewTargetNew:
  case CallIDynamic:
  case CallIDynamicSpread:
  case InlineThrow:
  case EHThrow:
  case Div_I4:
  case DivU_I4:
  case Rem_I4:
  case RemU_I4:
    goto switchD_00428aad_caseD_2e;
  case BrGe_I4:
    OVar5 = BrLe_I4;
    break;
  case BrGt_I4:
    OVar5 = BrLt_I4;
    break;
  case BrLt_I4:
    OVar5 = BrGt_I4;
    break;
  case BrLe_I4:
    OVar5 = BrGe_I4;
    break;
  case CallDirect:
  case Neg_I4:
  case Not_I4:
  case Sub_I4:
    goto switchD_00428aad_caseD_45;
  default:
    uVar4 = OVar5 - 0x1de;
    if (0x3f < uVar4) {
LAB_004288e0:
      uVar4 = OVar5 - 0xbe;
      if (uVar4 < 0x40) {
        if ((0x800000300b5b8003U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
          return;
        }
        if ((0xa40UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto switchD_00428a93_caseD_1f;
      }
      if ((OVar5 - 0x21f < 0x30) && ((0xda000006e0a1U >> ((ulong)(OVar5 - 0x21f) & 0x3f) & 1) != 0))
      {
        return;
      }
      switch(OVar5) {
      case StartCall:
      case BrNotHasSideEffects:
      case Ret:
        goto switchD_00428aad_caseD_45;
      case Break:
      case Br:
      case BrFncNeqApply:
      case BrFalse_A:
      case BrTrue_A:
      case BrOnHasLocalProperty:
      case BrOnHasLocalEnvProperty:
      case BrOnObject_A:
      case BrNotNull_A:
      case BrOnNotNullObj_A:
      case EndSwitch:
      case Case:
      case BeginSwitch:
      case ProfiledBeginSwitch:
      case CallIFlags:
      case CallIExtended:
      case CallIExtendedFlags:
      case Throw:
        goto switchD_00428aad_caseD_2e;
      case BrEq_A:
switchD_00428aad_caseD_3b:
        bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
        if (!bVar2) {
          local_34 = (this_00->m_valueType).field_0;
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
          if (!bVar2) {
            return;
          }
          local_32 = (this_01->m_valueType).field_0;
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
LAB_00428ae9:
          if (bVar2 == false) {
            return;
          }
        }
        break;
      case BrNeq_A:
      case BrSrEq_A:
      case BrSrNeq_A:
        break;
      case BrGe_A:
        OVar5 = BrLe_A;
        break;
      case BrGt_A:
        OVar5 = BrLt_A;
        break;
      case BrLt_A:
        OVar5 = BrGt_A;
        break;
      case BrLe_A:
        OVar5 = BrGe_A;
        break;
      case CallI:
        goto switchD_00428a93_caseD_1f;
      default:
        switch(OVar5) {
        case Add_A:
          OVar5 = Add_A;
          if (1 < (byte)(this_00->m_type - TyFloat32)) {
            return;
          }
          break;
        case Div_A:
        case ProfiledDiv_A:
        case Rem_A:
        case ProfiledRem_A:
        case Sub_A:
        case Expo_A:
        case Shl_A:
        case Shr_A:
        case ShrU_A:
        case CmSrEq_A:
        case CmSrNeq_A:
        case Conv_Num:
        case Conv_Obj:
          goto switchD_00428aad_caseD_2e;
        case Mul_A:
        case And_A:
        case Or_A:
        case Xor_A:
          break;
        case CmEq_A:
        case CmNeq_A:
          goto switchD_00428aad_caseD_3b;
        case CmGe_A:
          bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
          if (bVar2) {
            OVar5 = CmLe_A;
            break;
          }
          local_34 = (this_00->m_valueType).field_0;
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
          if (!bVar2) {
            return;
          }
          local_32 = (this_01->m_valueType).field_0;
          bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
          OVar5 = CmLe_A;
          goto LAB_00428ae9;
        case CmGt_A:
          bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
          if (!bVar2) {
            local_34 = (this_00->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
            if (!bVar2) {
              return;
            }
            local_32 = (this_01->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
            OVar5 = CmLt_A;
            goto LAB_00428ae9;
          }
          OVar5 = CmLt_A;
          break;
        case CmLt_A:
          bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
          if (!bVar2) {
            local_34 = (this_00->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
            if (!bVar2) {
              return;
            }
            local_32 = (this_01->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
            OVar5 = CmGt_A;
            goto LAB_00428ae9;
          }
          OVar5 = CmGt_A;
          break;
        case CmLe_A:
          bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
          if (!bVar2) {
            local_34 = (this_00->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_34.field_0);
            if (!bVar2) {
              return;
            }
            local_32 = (this_01->m_valueType).field_0;
            bVar2 = ValueType::IsPrimitive((ValueType *)&local_32.field_0);
            OVar5 = CmGe_A;
            goto LAB_00428ae9;
          }
          OVar5 = CmGe_A;
          break;
        case Ld_A:
          goto switchD_00428aad_caseD_45;
        default:
          if ((OVar5 - 0x70 < 0x2d) &&
             ((0x140000004405U >> ((ulong)(OVar5 - 0x70) & 0x3f) & 1) != 0)) {
            return;
          }
          if (OVar5 - 0x28b < 4) {
            return;
          }
          if (OVar5 - 0x173 < 2) {
            return;
          }
          if (OVar5 == ArgOut_A) {
            return;
          }
          if (OVar5 != NewScObjectSpread) {
            if (OVar5 == NewScGenFuncHomeObj) {
              return;
            }
            if (OVar5 != CallIFixed) {
              if (OVar5 == ExtendArg_A) {
                return;
              }
              goto switchD_00428aad_caseD_2e;
            }
          }
          goto switchD_00428a93_caseD_1f;
        }
      }
      break;
    }
    if ((0xc0000001062f80e7U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      return;
    }
    if ((ulong)uVar4 != 0x37) goto LAB_004288e0;
switchD_00428a93_caseD_1f:
    bVar2 = IR::Instr::HasFixedFunctionAddressTarget(instr);
    if (bVar2) {
      return;
    }
    goto switchD_00428aad_caseD_2e;
  }
  bVar2 = IR::Opnd::IsImmediateOpnd(instr->m_src2);
  if (bVar2) {
switchD_00428aad_caseD_2e:
    bVar2 = IR::Opnd::IsImmediateOpnd(this_00);
    if (bVar2) {
      bVar2 = IR::Opnd::IsIntConstOpnd(this_00);
      if (bVar2) {
        instr_00 = IR::Instr::HoistSrc1(instr,Ld_I4,RegNOREG,(StackSym *)0x0);
        pRVar3 = IR::Opnd::AsRegOpnd(instr_00->m_dst);
        ToInt32Dst(this,instr_00,pRVar3,this->currentBlock);
      }
      else {
        bVar2 = IR::Opnd::IsInt64ConstOpnd(this_00);
        if (bVar2) {
          OVar5 = Ld_I4;
        }
        else {
          OVar5 = Ld_A;
        }
        IR::Instr::HoistSrc1(instr,OVar5,RegNOREG,(StackSym *)0x0);
      }
      pRVar3 = IR::Opnd::AsRegOpnd(instr->m_src1);
      StackSym::SetIsConst(pRVar3->m_sym);
    }
  }
  else {
    instr->m_opcode = OVar5;
    IR::Instr::SwapOpnds(instr);
    pVVar1 = *pSrc1Val;
    *pSrc1Val = *pSrc2Val;
    *pSrc2Val = pVVar1;
  }
switchD_00428aad_caseD_45:
  return;
}

Assistant:

void
GlobOpt::PreLowerCanonicalize(IR::Instr *instr, Value **pSrc1Val, Value **pSrc2Val)
{
    IR::Opnd *dst = instr->GetDst();
    IR::Opnd *src1 = instr->GetSrc1();
    IR::Opnd *src2 = instr->GetSrc2();

    if (src1->IsImmediateOpnd())
    {
        // Swap for dst, src
    }
    else if (src2 && dst && src2->IsRegOpnd())
    {
        if (src2->GetIsDead() && !src1->GetIsDead() && !src1->IsEqual(dst))
        {
            // Swap if src2 is dead, as the reg can be reuse for the dst for opEqs like on x86 (ADD r1, r2)
        }
        else if (src2->IsEqual(dst))
        {
            // Helps lowering of opEqs
        }
        else
        {
            return;
        }
        // Make sure we don't swap 2 srcs with valueOf calls.
        if (OpCodeAttr::OpndHasImplicitCall(instr->m_opcode))
        {
            if (instr->IsBranchInstr())
            {
                if (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive())
                {
                    return;
                }
            }
            else if (!src1->GetValueType().IsPrimitive() && !src2->GetValueType().IsPrimitive())
            {
                return;
            }
        }
    }
    else
    {
        return;
    }
    Js::OpCode opcode = instr->m_opcode;
    switch (opcode)
    {
    case Js::OpCode::And_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::Xor_A:
    case Js::OpCode::And_I4:
    case Js::OpCode::Mul_I4:
    case Js::OpCode::Or_I4:
    case Js::OpCode::Xor_I4:
    case Js::OpCode::Add_I4:
swap_srcs:
        if (!instr->GetSrc2()->IsImmediateOpnd())
        {
            instr->m_opcode = opcode;
            instr->SwapOpnds();

            Value *tempVal = *pSrc1Val;
            *pSrc1Val = *pSrc2Val;
            *pSrc2Val = tempVal;
            return;
        }
        break;

    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
    case Js::OpCode::BrEq_I4:
        goto swap_srcs;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
    case Js::OpCode::BrNotEq_A:
    case Js::OpCode::BrNeq_I4:
        goto swap_srcs;

    case Js::OpCode::BrGe_A:
        opcode = Js::OpCode::BrLe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGe_A:
        opcode = Js::OpCode::BrNotLe_A;
        goto swap_srcs;

    case Js::OpCode::BrGe_I4:
        opcode = Js::OpCode::BrLe_I4;
        goto swap_srcs;

    case Js::OpCode::BrGt_A:
        opcode = Js::OpCode::BrLt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotGt_A:
        opcode = Js::OpCode::BrNotLt_A;
        goto swap_srcs;

    case Js::OpCode::BrGt_I4:
        opcode = Js::OpCode::BrLt_I4;
        goto swap_srcs;

    case Js::OpCode::BrLe_A:
        opcode = Js::OpCode::BrGe_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLe_A:
        opcode = Js::OpCode::BrNotGe_A;
        goto swap_srcs;

    case Js::OpCode::BrLe_I4:
        opcode = Js::OpCode::BrGe_I4;
        goto swap_srcs;

    case Js::OpCode::BrLt_A:
        opcode = Js::OpCode::BrGt_A;
        goto swap_srcs;

    case Js::OpCode::BrNotLt_A:
        opcode = Js::OpCode::BrNotGt_A;
        goto swap_srcs;

    case Js::OpCode::BrLt_I4:
        opcode = Js::OpCode::BrGt_I4;
        goto swap_srcs;

    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmNeq_A:
        // this == "" not the same as "" == this...
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        goto swap_srcs;

    case Js::OpCode::CmGe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLe_A;
        goto swap_srcs;

    case Js::OpCode::CmGt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmLt_A;
        goto swap_srcs;

    case Js::OpCode::CmLe_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGe_A;
        goto swap_srcs;

    case Js::OpCode::CmLt_A:
        if (!src1->IsImmediateOpnd() && (!src1->GetValueType().IsPrimitive() || !src2->GetValueType().IsPrimitive()))
        {
            return;
        }
        opcode = Js::OpCode::CmGt_A;
        goto swap_srcs;

    case Js::OpCode::CallI:
    case Js::OpCode::CallIFixed:
    case Js::OpCode::NewScObject:
    case Js::OpCode::NewScObjectSpread:
    case Js::OpCode::NewScObjArray:
    case Js::OpCode::NewScObjArraySpread:
    case Js::OpCode::NewScObjectNoCtor:
        // Don't insert load to register if the function operand is a fixed function.
        if (instr->HasFixedFunctionAddressTarget())
        {
            return;
        }
        break;

        // Can't do add because <32 + "Hello"> isn't equal to <"Hello" + 32>
        // Lower can do the swap. Other op-codes listed below don't need immediate source hoisting, as the fast paths handle it,
        // or the lowering handles the hoisting.
    case Js::OpCode::Add_A:
        if (src1->IsFloat())
        {
            goto swap_srcs;
        }
        return;

    case Js::OpCode::Sub_I4:
    case Js::OpCode::Neg_I4:
    case Js::OpCode::Not_I4:
    case Js::OpCode::NewScFunc:
    case Js::OpCode::NewScGenFunc:
    case Js::OpCode::NewScFuncHomeObj:
    case Js::OpCode::NewScGenFuncHomeObj:
    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScIntArray:
    case Js::OpCode::NewScFltArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::NewRegEx:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:
    case Js::OpCode::ThrowRuntimeError:
    case Js::OpCode::TrapIfMinIntOverNegOne:
    case Js::OpCode::TrapIfTruncOverflow:
    case Js::OpCode::TrapIfZero:
    case Js::OpCode::TrapIfUnalignedAccess:
    case Js::OpCode::FromVar:
    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::LdStr:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StartCall:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::ArgOut_A_InlineSpecialized:
    case Js::OpCode::ArgOut_A_SpreadArg:
    case Js::OpCode::InlineeEnd:
    case Js::OpCode::EndCallForPolymorphicInlinee:
    case Js::OpCode::InlineeMetaArg:
    case Js::OpCode::InlineBuiltInEnd:
    case Js::OpCode::InlineNonTrackingBuiltInEnd:
    case Js::OpCode::CallHelper:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
    case Js::OpCode::RuntimeTypeError:
    case Js::OpCode::RuntimeReferenceError:
    case Js::OpCode::Ret:
    case Js::OpCode::NewScObjectSimple:
    case Js::OpCode::NewScObjectLiteral:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StElemC:
    case Js::OpCode::StArrSegElemC:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::CallDirect:
    case Js::OpCode::BrNotHasSideEffects:
    case Js::OpCode::NewConcatStrMulti:
    case Js::OpCode::NewConcatStrMultiBE:
    case Js::OpCode::ExtendArg_A:
    case Js::OpCode::NewScopeSlots:
    case Js::OpCode::NewScopeSlotsWithoutPropIds:
    case Js::OpCode::NewStackScopeSlots:
    case Js::OpCode::IsInst:
    case Js::OpCode::BailOnEqual:
    case Js::OpCode::BailOnNotEqual:
    case Js::OpCode::StArrViewElem:
        return;
    }

    if (!src1->IsImmediateOpnd())
    {
        return;
    }

    // The fast paths or lowering of the remaining instructions may not support handling immediate opnds for the first src. The
    // immediate src1 is hoisted here into a separate instruction.
    if (src1->IsIntConstOpnd())
    {
        IR::Instr *newInstr = instr->HoistSrc1(Js::OpCode::Ld_I4);
        ToInt32Dst(newInstr, newInstr->GetDst()->AsRegOpnd(), this->currentBlock);
    }
    else if (src1->IsInt64ConstOpnd())
    {
        instr->HoistSrc1(Js::OpCode::Ld_I4);
    }
    else
    {
        instr->HoistSrc1(Js::OpCode::Ld_A);
    }
    src1 = instr->GetSrc1();
    src1->AsRegOpnd()->m_sym->SetIsConst();
}